

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpsreader.cc
# Opt level: O0

void fizplex::MPSReader::parse_and_add_rhs
               (string *first_word,istringstream *iss,index_map *rows,LP *lp)

{
  long lVar1;
  Row *pRVar2;
  LP *this;
  LP *in_RCX;
  string *in_RDI;
  double dVar3;
  Row *rh;
  double rhs_value;
  string row_name;
  bool has_rhs_name;
  key_type *in_stack_ffffffffffffff08;
  LP *in_stack_ffffffffffffff10;
  mapped_type *in_stack_ffffffffffffff18;
  LP *in_stack_ffffffffffffff20;
  istringstream *in_stack_ffffffffffffff28;
  LP *in_stack_ffffffffffffff30;
  mapped_type *in_stack_ffffffffffffff38;
  string local_80 [32];
  double local_60;
  string local_58 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_30;
  byte local_21;
  LP *local_20;
  string *local_8;
  
  local_20 = in_RCX;
  local_8 = in_RDI;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)in_stack_ffffffffffffff08,(key_type *)0x1ef3ac);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              *)in_stack_ffffffffffffff08);
  local_21 = std::__detail::operator==(&local_30,&local_38);
  while( true ) {
    std::__cxx11::istringstream::rdbuf();
    lVar1 = std::streambuf::in_avail();
    if (lVar1 < 1) break;
    if ((local_21 & 1) == 0) {
      std::__cxx11::string::string(local_58,local_8);
    }
    else {
      next_word(in_stack_ffffffffffffff28);
    }
    local_21 = 1;
    next_word(in_stack_ffffffffffffff28);
    dVar3 = std::__cxx11::stod((string *)in_stack_ffffffffffffff10,
                               (size_t *)in_stack_ffffffffffffff08);
    std::__cxx11::string::~string(local_80);
    local_60 = dVar3;
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    pRVar2 = LP::row_header(in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18);
    this = (LP *)(ulong)pRVar2->type;
    switch(this) {
    case (LP *)0x0:
      in_stack_ffffffffffffff10 = local_20;
      in_stack_ffffffffffffff18 =
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 *)local_20,in_stack_ffffffffffffff08);
      LP::update_row_header
                (this,(size_t)in_stack_ffffffffffffff38,
                 (RowType)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                 (double)in_stack_ffffffffffffff28,(double)in_stack_ffffffffffffff20);
      break;
    default:
      break;
    case (LP *)0x2:
      in_stack_ffffffffffffff30 = local_20;
      in_stack_ffffffffffffff38 =
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      LP::update_row_header
                (this,(size_t)in_stack_ffffffffffffff38,
                 (RowType)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                 (double)in_stack_ffffffffffffff28,(double)in_stack_ffffffffffffff20);
      break;
    case (LP *)0x3:
      break;
    case (LP *)0x4:
      in_stack_ffffffffffffff20 = local_20;
      in_stack_ffffffffffffff28 =
           (istringstream *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      LP::update_row_header
                (this,(size_t)in_stack_ffffffffffffff38,
                 (RowType)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                 (double)in_stack_ffffffffffffff28,(double)in_stack_ffffffffffffff20);
    }
    std::__cxx11::string::~string(local_58);
  }
  return;
}

Assistant:

void parse_and_add_rhs(const std::string &first_word, std::istringstream &iss,
                       const index_map &rows, LP &lp) {
  bool has_rhs_name = (rows.find(first_word) == rows.end());
  while (iss.rdbuf()->in_avail() > 0) {
    const auto row_name = has_rhs_name ? next_word(iss) : first_word;
    has_rhs_name = true;
    const auto rhs_value = std::stod(next_word(iss));
    const LP::Row &rh = lp.row_header(rows.at(row_name));
    switch (rh.type) {
    case RowType::LE:
      lp.update_row_header(rows.at(row_name), rh.type, rh.lower, rhs_value);
      break;
    case RowType::GE:
      lp.update_row_header(rows.at(row_name), rh.type, rhs_value, rh.upper);
      break;
    case RowType::Equality:
      lp.update_row_header(rows.at(row_name), rh.type, rhs_value, rhs_value);
      break;
    case RowType::NonBinding: // RHS irrelevant
      break;
    default:
      break;
    }
  }
}